

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O2

void __thiscall
itlib::small_vector<long,_4UL,_0UL,_std::allocator<long>_>::assign_impl
          (small_vector<long,_4UL,_0UL,_std::allocator<long>_> *this,size_type count,long *value)

{
  long *plVar1;
  long *plVar2;
  size_t sVar3;
  bool bVar4;
  
  plVar2 = choose_data(this,count);
  this->m_end = plVar2;
  this->m_begin = plVar2;
  plVar1 = plVar2;
  while( true ) {
    bVar4 = count == 0;
    count = count - 1;
    if (bVar4) break;
    *plVar1 = *value;
    this->m_end = plVar1 + 1;
    plVar1 = plVar1 + 1;
  }
  if ((type *)plVar2 == this->m_static_data) {
    sVar3 = 4;
  }
  else {
    sVar3 = this->m_dynamic_capacity;
  }
  this->m_capacity = sVar3;
  return;
}

Assistant:

void assign_impl(size_type count, const T& value)
    {
        assert(m_begin);
        assert(m_begin == m_end);

        m_begin = m_end = choose_data(count);
        for (size_type i = 0; i < count; ++i)
        {
            atraits::construct(get_alloc(), m_end, value);
            ++m_end;
        }

        update_capacity();
    }